

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateModuleTypePrototypes(ExpressionTranslateContext *ctx)

{
  uint uVar1;
  TypeBase *type;
  TypeBase **ppTVar2;
  uint i;
  uint index;
  TypeClass *typeClass;
  
  PrintIndentedLine(ctx,"// Type prototypes");
  index = 0;
  do {
    if ((ctx->ctx->types).count <= index) {
      PrintLine(ctx);
      return;
    }
    ppTVar2 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->ctx->types,index);
    type = *ppTVar2;
    if ((type->isGeneric == false) && (uVar1 = type->typeID, uVar1 < 0x1a)) {
      if ((0x2130000U >> (uVar1 & 0x1f) & 1) == 0) {
        if (uVar1 != 0x13) {
          if ((uVar1 != 0x18) ||
             ((type->importModule != (ModuleData *)0x0 &&
              (*(char *)((long)&type[3]._vptr_TypeBase + 1) != '\0')))) goto LAB_002384ce;
          goto LAB_002384a1;
        }
        Print(ctx,"struct ");
        PrintEscapedName(ctx,type->name);
      }
      else {
LAB_002384a1:
        Print(ctx,"struct ");
        PrintEscapedTypeName(ctx,type);
      }
      Print(ctx,";");
      PrintLine(ctx);
    }
LAB_002384ce:
    index = index + 1;
  } while( true );
}

Assistant:

void TranslateModuleTypePrototypes(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Type prototypes");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
			continue;

		if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(type))
			{
				if(typeClass->importModule && typeClass->isInternal)
					continue;
			}

			Print(ctx, "struct ");
			PrintEscapedTypeName(ctx, typeStruct);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(TypeArray *typeArray = getType<TypeArray>(type))
		{
			Print(ctx, "struct ");
			PrintEscapedName(ctx, typeArray->name);
			Print(ctx, ";");
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}